

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

void __thiscall BMP::buildingCodeShannonFano(BMP *this,char lit,string *code,int left,int right)

{
  bool bVar1;
  string local_b0 [48];
  string local_80 [36];
  int local_5c;
  undefined1 auStack_58 [4];
  int i;
  longdouble temp;
  int local_3c;
  undefined1 auStack_38 [4];
  int medium;
  longdouble midFrq;
  int local_24;
  int right_local;
  int left_local;
  string *code_local;
  BMP *pBStack_10;
  char lit_local;
  BMP *this_local;
  
  unique0x100001df = right;
  local_24 = left;
  _right_local = code;
  code_local._7_1_ = lit;
  pBStack_10 = this;
  if ((lit == '1') || (lit == '0')) {
    std::__cxx11::string::operator+=((string *)code,lit);
  }
  else {
    std::__cxx11::string::operator=((string *)code,"");
  }
  if (local_24 == stack0xffffffffffffffd8) {
    std::__cxx11::string::operator=
              ((string *)&this->alphabet->symbol[local_24].codeShannonFano,(string *)code);
  }
  else {
    _auStack_58 = (longdouble)0;
    local_3c = local_24;
    _auStack_38 = _auStack_58;
    for (local_5c = local_24; local_5c < stack0xffffffffffffffd8; local_5c = local_5c + 1) {
      _auStack_38 = _auStack_38 + this->alphabet->symbol[local_5c].frq;
    }
    _auStack_38 = (longdouble)0.5 * _auStack_38;
    while( true ) {
      bVar1 = false;
      if (local_3c < stack0xffffffffffffffd8) {
        bVar1 = this->alphabet->symbol[local_3c].frq + _auStack_58 < _auStack_38;
      }
      if (!bVar1) break;
      _auStack_58 = _auStack_58 + this->alphabet->symbol[local_3c].frq;
      local_3c = local_3c + 1;
    }
    std::__cxx11::string::string(local_80,(string *)code);
    buildingCodeShannonFano(this,'1',(string *)local_80,local_24,local_3c);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::string(local_b0,(string *)code);
    buildingCodeShannonFano(this,'0',(string *)local_b0,local_3c + 1,stack0xffffffffffffffd8);
    std::__cxx11::string::~string(local_b0);
  }
  return;
}

Assistant:

void BMP::buildingCodeShannonFano(char lit, std::string code, int left, int right)
{
    if ( lit != '1' && lit != '0' ) {
        code = "";
    } else {
        code += lit;
    }

    if ( left == right ) {
        alphabet->symbol[ left ].codeShannonFano = code;
    } else {
        long double midFrq = 0;
        int medium         = left;
        long double temp   = 0;

        for ( auto i = left; i < right; i++ ){
            midFrq += alphabet->symbol[ i ].frq;
        }

        midFrq /= 2;

        while ( medium < right && temp + alphabet->symbol[ medium ].frq < midFrq){
            temp += alphabet->symbol[ medium ].frq;
            medium++;
        }

        buildingCodeShannonFano( '1', code, left, medium );
        buildingCodeShannonFano( '0', code, medium + 1, right );
    }
}